

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O0

void pigpio_stop(int pi)

{
  int in_EDI;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  
  if (((-1 < in_EDI) && (in_EDI < 0x20)) && (gPiInUse[in_EDI] != 0)) {
    if (gPthNotify[in_EDI] != (pthread_t *)0x0) {
      stop_thread((pthread_t *)0x105d82);
      gPthNotify[in_EDI] = (pthread_t *)0x0;
    }
    if (-1 < gPigCommand[in_EDI]) {
      if (-1 < gPigHandle[in_EDI]) {
        pigpio_command(in_stack_00000010,in_stack_0000000c,in_stack_00000008,pi,unaff_retaddr);
        gPigHandle[in_EDI] = -1;
      }
      close(gPigCommand[in_EDI]);
      gPigCommand[in_EDI] = -1;
    }
    if (-1 < gPigNotify[in_EDI]) {
      close(gPigNotify[in_EDI]);
      gPigNotify[in_EDI] = -1;
    }
    gPiInUse[in_EDI] = 0;
  }
  return;
}

Assistant:

void pigpio_stop(int pi)
{
   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi]) return;

   if (gPthNotify[pi])
   {
      stop_thread(gPthNotify[pi]);
      gPthNotify[pi] = 0;
   }

   if (gPigCommand[pi] >= 0)
   {
      if (gPigHandle[pi] >= 0)
      {
         pigpio_command(pi, PI_CMD_NC, gPigHandle[pi], 0, 1);
         gPigHandle[pi] = -1;
      }

      close(gPigCommand[pi]);
      gPigCommand[pi] = -1;
   }

   if (gPigNotify[pi] >= 0)
   {
      close(gPigNotify[pi]);
      gPigNotify[pi] = -1;
   }

   gPiInUse[pi] = 0;
}